

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

void aggregate_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  Am_Draw_Method_Type *pAVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Am_Value *pAVar7;
  Am_State_Store *this;
  uint x_offset_00;
  uint y_offset_00;
  Am_Object item;
  Am_Value_List components;
  Am_Draw_Method draw_method;
  Am_Object local_60;
  undefined1 local_58 [8];
  Am_Value_List local_50;
  Am_Draw_Method local_40;
  
  pAVar7 = Am_Object::Get(self,100,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x65,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x66,0);
  uVar5 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x67,0);
  uVar6 = Am_Value::operator_cast_to_int(pAVar7);
  if (uVar6 != 0 && uVar5 != 0) {
    x_offset_00 = iVar3 + x_offset;
    y_offset_00 = iVar4 + y_offset;
    (*drawonable->_vptr_Am_Drawonable[0x21])
              (drawonable,(ulong)x_offset_00,(ulong)y_offset_00,(ulong)uVar5,(ulong)uVar6);
    pAVar7 = Am_Object::Get(self,0x82,0);
    Am_Value_List::Am_Value_List(&local_50,pAVar7);
    local_60.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&local_50);
    while( true ) {
      bVar2 = Am_Value_List::Last(&local_50);
      if (bVar2) break;
      pAVar7 = Am_Value_List::Get(&local_50);
      Am_Object::operator=(&local_60,pAVar7);
      pAVar7 = Am_Object::Get(&local_60,0x7d8,0);
      this = (Am_State_Store *)Am_Value::operator_cast_to_void_(pAVar7);
      bVar2 = Am_State_Store::Visible(this,drawonable,x_offset_00,y_offset_00);
      if (bVar2) {
        pAVar7 = Am_Object::Get(&local_60,0x7d1,0);
        Am_Draw_Method::Am_Draw_Method(&local_40,pAVar7);
        pAVar1 = local_40.Call;
        Am_Object::Am_Object((Am_Object *)local_58,&local_60);
        (*pAVar1)((Am_Object_Data *)local_58,drawonable,x_offset_00,y_offset_00);
        Am_Object::~Am_Object((Am_Object *)local_58);
      }
      Am_Value_List::Next(&local_50);
    }
    (*drawonable->_vptr_Am_Drawonable[0x22])(drawonable);
    Am_Object::~Am_Object(&local_60);
    Am_Value_List::~Am_Value_List(&local_50);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, aggregate_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  if (width && height) {
    drawonable->Push_Clip(left, top, width, height);
    Am_Value_List components = self.Get(Am_GRAPHICAL_PARTS);
    Am_Object item;
    for (components.Start(); !components.Last(); components.Next()) {
      item = components.Get();
      Am_State_Store *state = Am_State_Store::Narrow(item.Get(Am_PREV_STATE));
      if (state->Visible(drawonable, left, top)) {
        Am_Draw_Method draw_method = item.Get(Am_MASK_METHOD);
        draw_method.Call(item, drawonable, left, top);
      }
    }
    drawonable->Pop_Clip();
  }
}